

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::BasicGraphicsTestInstance::buildVertexBuffer
          (BasicGraphicsTestInstance *this)

{
  pointer __src;
  Allocation *pAVar1;
  DeviceInterface *vkd;
  VkDevice device;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_68;
  _Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_48;
  VkAllocationCallbacks *pVStack_30;
  
  vkd = Context::getDeviceInterface
                  ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_TimestampTestInstance).super_TestInstance.m_context);
  TimestampTestInstance::createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&local_68,&this->super_TimestampTestInstance,
             0x400,0x80,&this->m_vertexBufferAlloc);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_68.m_data.deleter.m_device;
  pVStack_30 = local_68.m_data.deleter.m_allocator;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)local_68.m_data.object.m_internal;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_68.m_data.deleter.m_deviceIface;
  local_68.m_data.object.m_internal = 0;
  local_68.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_68.m_data.deleter.m_device = (VkDevice)0x0;
  local_68.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVStack_30;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       (deUint64)local_48._M_impl.super__Vector_impl_data._M_start;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_48._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_68);
  createOverlappingQuads();
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  _M_move_assign(&this->m_vertices,&local_48);
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base(&local_48);
  __src = (this->m_vertices).
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start;
  memcpy(((this->m_vertexBufferAlloc).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,__src,
         (long)(this->m_vertices).
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
  pAVar1 = (this->m_vertexBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,0x400);
  return;
}

Assistant:

void BasicGraphicsTestInstance::buildVertexBuffer(void)
{
	const DeviceInterface&      vk       = m_context.getDeviceInterface();
	const VkDevice              vkDevice = m_context.getDevice();

	// Create vertex buffer
	{
		m_vertexBuffer = createBufferAndBindMemory(1024u, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT, &m_vertexBufferAlloc);

		m_vertices          = createOverlappingQuads();
		// Load vertices into vertex buffer
		deMemcpy(m_vertexBufferAlloc->getHostPtr(), m_vertices.data(), m_vertices.size() * sizeof(Vertex4RGBA));
		flushMappedMemoryRange(vk, vkDevice, m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), 1024u);
	}
}